

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

int ON_MeshComponentRef::Compare(ON_MeshComponentRef *lhs,ON_MeshComponentRef *rhs)

{
  ON__UINT_PTR rhs_ptr;
  ON__UINT_PTR lhs_ptr;
  ON_MeshComponentRef *rhs_local;
  ON_MeshComponentRef *lhs_local;
  
  if (lhs == rhs) {
    lhs_local._4_4_ = 0;
  }
  else if (lhs == (ON_MeshComponentRef *)0x0) {
    lhs_local._4_4_ = 1;
  }
  else if (rhs == (ON_MeshComponentRef *)0x0) {
    lhs_local._4_4_ = -1;
  }
  else if (lhs->m_mesh < rhs->m_mesh) {
    lhs_local._4_4_ = -1;
  }
  else if (rhs->m_mesh < lhs->m_mesh) {
    lhs_local._4_4_ = 1;
  }
  else {
    lhs_local._4_4_ = ON_COMPONENT_INDEX::Compare(&lhs->m_mesh_ci,&rhs->m_mesh_ci);
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_MeshComponentRef::Compare(const ON_MeshComponentRef* lhs, const ON_MeshComponentRef* rhs)
{
  if (lhs == rhs)
    return 0;

  // nullptrs are last
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;

  const ON__UINT_PTR lhs_ptr = (ON__UINT_PTR)lhs->m_mesh;
  const ON__UINT_PTR rhs_ptr = (ON__UINT_PTR)rhs->m_mesh;
  if (lhs_ptr < rhs_ptr)
    return -1;
  if (lhs_ptr > rhs_ptr)
    return 1;

  return ON_COMPONENT_INDEX::Compare(&lhs->m_mesh_ci, &rhs->m_mesh_ci);
}